

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long value,uint prefix,format_specs *specs,
          digit_grouping<char> *grouping)

{
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  basic_appender<char> out_02;
  basic_appender<char> out_03;
  presentation_type pVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  make_unsigned_t<int> mVar6;
  int iVar7;
  basic_specs *in_RCX;
  uint in_EDX;
  long in_RSI;
  uint size;
  memory_buffer buffer;
  int num_digits;
  allocator<char> *in_stack_fffffffffffffca8;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc4;
  char value_00;
  basic_appender<char> in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcdc;
  basic_appender<char> in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffd00;
  int iVar8;
  int in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd08;
  undefined2 in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  undefined8 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd4c;
  size_t in_stack_fffffffffffffd50;
  basic_appender<char> in_stack_fffffffffffffd58;
  basic_appender<char> in_stack_fffffffffffffd60;
  basic_appender<char> in_stack_fffffffffffffd68;
  basic_appender<char> local_290;
  buffer<char> *local_288;
  basic_appender<char> local_280;
  buffer<char> *local_278;
  basic_appender<char> local_270 [3];
  bool local_252 [2];
  buffer<char> local_250 [16];
  int local_34;
  basic_specs *local_28;
  uint local_1c;
  long local_18;
  buffer<char> *local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  uVar2 = (undefined1)((uint)in_stack_fffffffffffffd00 >> 0x18);
  value_00 = (char)((uint)in_stack_fffffffffffffcc4 >> 0x18);
  local_34 = 0;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pVar1 = basic_specs::type(local_28);
  switch(pVar1) {
  default:
    local_252[0] = false;
    ignore_unused<bool,char[1]>(local_252,(char (*) [1])0x2d0f2f);
  case none:
  case dec:
    local_34 = count_digits(0x255f85);
    basic_appender<char>::basic_appender(local_270,local_250);
    out_00.container._4_4_ = in_stack_fffffffffffffcec;
    out_00.container._0_4_ = in_stack_fffffffffffffce8;
    local_278 = (buffer<char> *)
                format_decimal<char,_unsigned_long,_fmt::v11::basic_appender<char>,_0>
                          (out_00,in_stack_fffffffffffffce0.container,in_stack_fffffffffffffcdc);
    break;
  case hex:
    uVar2 = basic_specs::alt(local_28);
    if ((bool)uVar2) {
      in_stack_fffffffffffffd0e = basic_specs::upper(local_28);
      prefix_append(&local_1c,((byte)~in_stack_fffffffffffffd0e & 1) << 0xd | 0x5830);
    }
    iVar4 = count_digits<4,unsigned_long>((unsigned_long)in_stack_fffffffffffffcb0);
    local_34 = iVar4;
    basic_appender<char>::basic_appender(&local_280,local_250);
    iVar8 = local_34;
    bVar3 = basic_specs::upper(local_28);
    out_01.container._4_4_ = in_stack_fffffffffffffd1c;
    out_01.container._0_4_ = in_stack_fffffffffffffd18;
    local_288 = (buffer<char> *)
                format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
                          (iVar7,out_01,
                           CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd0e,
                                                   CONCAT24(in_stack_fffffffffffffd0c,iVar4))),
                           CONCAT13(bVar3,(int3)in_stack_fffffffffffffd04),
                           SUB41((uint)iVar8 >> 0x18,0));
    break;
  case oct:
    local_34 = count_digits<3,unsigned_long>((unsigned_long)in_stack_fffffffffffffcb0);
    bVar3 = basic_specs::alt(local_28);
    if (((bVar3) && (*(int *)local_28[1].fill_data_ <= local_34)) && (local_18 != 0)) {
      prefix_append(&local_1c,0x30);
    }
    basic_appender<char>::basic_appender(&local_290,local_250);
    out_02.container._4_4_ = in_stack_fffffffffffffd1c;
    out_02.container._0_4_ = in_stack_fffffffffffffd18;
    in_stack_fffffffffffffce0 =
         format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
                   (iVar7,out_02,
                    CONCAT17(in_stack_fffffffffffffd0f,
                             CONCAT16(in_stack_fffffffffffffd0e,
                                      CONCAT24(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
                            ),in_stack_fffffffffffffd04,(bool)uVar2);
    in_stack_fffffffffffffd68 = in_stack_fffffffffffffce0;
    break;
  case bin:
    bVar3 = basic_specs::alt(local_28);
    in_stack_fffffffffffffcdc = CONCAT13(bVar3,(int3)in_stack_fffffffffffffcdc);
    if (bVar3) {
      bVar3 = basic_specs::upper(local_28);
      in_stack_fffffffffffffcdc =
           CONCAT13((char)((uint)in_stack_fffffffffffffcdc >> 0x18),
                    CONCAT12(bVar3,(short)in_stack_fffffffffffffcdc));
      prefix_append(&local_1c,((byte)~bVar3 & 1) << 0xd | 0x4230);
    }
    local_34 = count_digits<1,unsigned_long>((unsigned_long)in_stack_fffffffffffffcb0);
    basic_appender<char>::basic_appender((basic_appender<char> *)&stack0xfffffffffffffd60,local_250)
    ;
    out_03.container._4_4_ = in_stack_fffffffffffffd1c;
    out_03.container._0_4_ = in_stack_fffffffffffffd18;
    in_stack_fffffffffffffd58 =
         format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned_long,_0>
                   (iVar7,out_03,
                    CONCAT17(in_stack_fffffffffffffd0f,
                             CONCAT16(in_stack_fffffffffffffd0e,
                                      CONCAT24(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
                            ),in_stack_fffffffffffffd04,(bool)uVar2);
    break;
  case chr:
    local_8 = (buffer<char> *)
              write_char<char,fmt::v11::basic_appender<char>>
                        (in_stack_fffffffffffffcc8,value_00,
                         (format_specs *)
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    goto LAB_002563d4;
  }
  if (local_1c == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = local_1c >> 0x18;
  }
  mVar6 = to_unsigned<int>(0);
  iVar7 = uVar5 + mVar6;
  digit_grouping<char>::count_separators
            ((digit_grouping<char> *)in_stack_fffffffffffffce0.container,in_stack_fffffffffffffcdc);
  mVar6 = to_unsigned<int>(0);
  local_8 = (buffer<char> *)
            write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>(fmt::v11::basic_appender<char>,unsigned_long,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                      (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60.container,
                       in_stack_fffffffffffffd58.container,in_stack_fffffffffffffd50,
                       (anon_class_24_3_e2c60416 *)CONCAT44(in_stack_fffffffffffffd4c,iVar7 + mVar6)
                      );
LAB_002563d4:
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x2563e1);
  return (basic_appender<char>)local_8;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}